

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

_Bool twall(loc_conflict grid)

{
  _Bool _Var1;
  loc_conflict grid_local;
  
  _Var1 = square_isdiggable((chunk *)cave,grid);
  if ((!_Var1) && (_Var1 = square_iscloseddoor((chunk *)cave,grid), !_Var1)) {
    return false;
  }
  sound(0x16);
  square_forget((chunk *)cave,grid);
  square_tunnel_wall((chunk *)cave,grid);
  player->upkeep->update = player->upkeep->update | 0x60;
  return true;
}

Assistant:

static bool twall(struct loc grid)
{
	/* Paranoia -- Require a wall or door or some such */
	if (!(square_isdiggable(cave, grid) || square_iscloseddoor(cave, grid)))
		return (false);

	/* Sound */
	sound(MSG_DIG);

	/* Forget the wall */
	square_forget(cave, grid);

	/* Remove the feature */
	square_tunnel_wall(cave, grid);

	/* Update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Result */
	return (true);
}